

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1c0a25::PhonyCommand::getShortDescription
          (PhonyCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_ostream local_40;
  SmallVectorImpl<char> *local_18;
  
  local_40.BufferMode = InternalBuffer;
  local_40.OutBufStart = (char *)0x0;
  local_40.OutBufEnd = (char *)0x0;
  local_40.OutBufCur = (char *)0x0;
  local_40._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
  local_18 = result;
  llvm::raw_ostream::SetUnbuffered(&local_40);
  Str.Data = (this->super_ExternalCommand).super_Command.name._M_dataplus._M_p;
  Str.Length = (this->super_ExternalCommand).super_Command.name._M_string_length;
  llvm::raw_ostream::operator<<(&local_40,Str);
  llvm::raw_ostream::~raw_ostream(&local_40);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getName();
  }